

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O3

Id __thiscall
anon_unknown.dwarf_12a4996::TGlslangToSpvTraverser::CreateInvocationsVectorOperation
          (TGlslangToSpvTraverser *this,Op op,GroupOperation groupOperation,Id typeId,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *operands)

{
  Builder *this_00;
  Instruction *pIVar1;
  IdImmediate IVar2;
  undefined4 uVar3;
  Id IVar4;
  IdImmediate IVar5;
  IdImmediate *__args;
  Id typeId_00;
  uint uVar6;
  IdImmediate operand;
  vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> spvGroupOperands;
  IdImmediate scalar;
  IdImmediate groupOp;
  vector<unsigned_int,_std::allocator<unsigned_int>_> results;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  IdImmediate local_b0;
  void *local_a8;
  iterator iStack_a0;
  IdImmediate *local_98;
  IdImmediate local_90;
  uint local_88;
  Id local_84;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_80;
  IdImmediate local_78;
  Id local_70;
  GroupOperation local_6c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_80 = operands;
  local_6c = groupOperation;
  if ((int)op < 0x1150) {
    if ((op - OpGroupIAdd < 8) || (op == OpSubgroupFirstInvocationKHR)) {
LAB_00449310:
      this_00 = &this->builder;
      pIVar1 = (this->builder).module.idToInstruction.
               super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
               super__Vector_impl_data._M_start
               [*(operands->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                 .super__Vector_impl_data._M_start];
      typeId_00 = 0;
      IVar4 = 0;
      if (pIVar1 != (Instruction *)0x0) {
        IVar4 = pIVar1->typeId;
      }
      local_70 = typeId;
      local_88 = spv::Builder::getNumTypeConstituents(this_00,IVar4);
      pIVar1 = (this->builder).module.idToInstruction.
               super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
               super__Vector_impl_data._M_start
               [*(local_80->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                 .super__Vector_impl_data._M_start];
      if (pIVar1 != (Instruction *)0x0) {
        typeId_00 = pIVar1->typeId;
      }
      local_84 = spv::Builder::getScalarTypeId(this_00,typeId_00);
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (uint *)0x0;
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
      if (0 < (int)local_88) {
        uVar6 = 0;
        do {
          local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_a8 = (void *)CONCAT44(local_a8._4_4_,uVar6);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_48,(iterator)0x0,(uint *)&local_a8);
          local_90.word =
               spv::Builder::createCompositeExtract
                         (this_00,*(local_80->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_start,local_84,&local_48);
          local_90.isId = true;
          local_98 = (IdImmediate *)0x0;
          local_a8 = (void *)0x0;
          iStack_a0._M_current = (IdImmediate *)0x0;
          if (op == OpSubgroupFirstInvocationKHR) {
LAB_00449504:
            __args = &local_90;
LAB_00449509:
            std::vector<spv::IdImmediate,std::allocator<spv::IdImmediate>>::
            _M_realloc_insert<spv::IdImmediate_const&>
                      ((vector<spv::IdImmediate,std::allocator<spv::IdImmediate>> *)&local_a8,
                       iStack_a0,__args);
          }
          else {
            if (op == OpSubgroupReadInvocationKHR) {
              std::vector<spv::IdImmediate,std::allocator<spv::IdImmediate>>::
              _M_realloc_insert<spv::IdImmediate_const&>
                        ((vector<spv::IdImmediate,std::allocator<spv::IdImmediate>> *)&local_a8,
                         (iterator)0x0,&local_90);
              local_b0.word =
                   (local_80->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start[1];
              local_b0.isId = true;
              if (iStack_a0._M_current == local_98) {
                __args = &local_b0;
                goto LAB_00449509;
              }
              IVar5.word = local_b0.word;
              IVar5.isId = true;
              IVar5._1_3_ = local_b0._1_3_;
            }
            else {
              IVar4 = spv::Builder::makeIntegerType(this_00,0x20,false);
              local_b0.word = spv::Builder::makeIntConstant(this_00,IVar4,3,false);
              local_b0.isId = true;
              if (iStack_a0._M_current == local_98) {
                std::vector<spv::IdImmediate,std::allocator<spv::IdImmediate>>::
                _M_realloc_insert<spv::IdImmediate_const&>
                          ((vector<spv::IdImmediate,std::allocator<spv::IdImmediate>> *)&local_a8,
                           iStack_a0,&local_b0);
              }
              else {
                IVar2.word = local_b0.word;
                IVar2.isId = true;
                IVar2._1_3_ = local_b0._1_3_;
                *iStack_a0._M_current = IVar2;
                iStack_a0._M_current = iStack_a0._M_current + 1;
              }
              uVar3 = local_78._0_4_;
              local_78._0_4_ = local_78._0_4_ & 0xffffff00;
              local_78.word = local_6c;
              if (iStack_a0._M_current == local_98) {
                std::vector<spv::IdImmediate,std::allocator<spv::IdImmediate>>::
                _M_realloc_insert<spv::IdImmediate_const&>
                          ((vector<spv::IdImmediate,std::allocator<spv::IdImmediate>> *)&local_a8,
                           iStack_a0,&local_78);
              }
              else {
                *iStack_a0._M_current = (IdImmediate)(CONCAT44(local_6c,uVar3) & 0xffffffffffffff00)
                ;
                iStack_a0._M_current = iStack_a0._M_current + 1;
              }
              if (iStack_a0._M_current == local_98) goto LAB_00449504;
              IVar5.word = local_90.word;
              IVar5.isId = local_90.isId;
              IVar5._1_3_ = local_90._1_3_;
            }
            *iStack_a0._M_current = IVar5;
            iStack_a0._M_current = iStack_a0._M_current + 1;
          }
          local_b0._0_4_ =
               spv::Builder::createOp
                         (this_00,op,local_84,
                          (vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&local_a8);
          if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_68,
                       (iterator)
                       local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_b0);
          }
          else {
            *local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = local_b0._0_4_;
            local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          if (local_a8 != (void *)0x0) {
            operator_delete(local_a8,(long)local_98 - (long)local_a8);
          }
          if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_48.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_48.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          uVar6 = uVar6 + 1;
        } while (local_88 != uVar6);
      }
      IVar4 = spv::Builder::createCompositeConstruct(this_00,local_70,&local_68);
      if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_68.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      return IVar4;
    }
  }
  else if ((op - OpGroupIAddNonUniformAMD < 8) || (op == OpSubgroupReadInvocationKHR))
  goto LAB_00449310;
  __assert_fail("op == spv::OpGroupFMin || op == spv::OpGroupUMin || op == spv::OpGroupSMin || op == spv::OpGroupFMax || op == spv::OpGroupUMax || op == spv::OpGroupSMax || op == spv::OpGroupFAdd || op == spv::OpGroupIAdd || op == spv::OpGroupBroadcast || op == spv::OpSubgroupReadInvocationKHR || op == spv::OpSubgroupFirstInvocationKHR || op == spv::OpGroupFMinNonUniformAMD || op == spv::OpGroupUMinNonUniformAMD || op == spv::OpGroupSMinNonUniformAMD || op == spv::OpGroupFMaxNonUniformAMD || op == spv::OpGroupUMaxNonUniformAMD || op == spv::OpGroupSMaxNonUniformAMD || op == spv::OpGroupFAddNonUniformAMD || op == spv::OpGroupIAddNonUniformAMD"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                ,0x21e5,
                "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::CreateInvocationsVectorOperation(spv::Op, spv::GroupOperation, spv::Id, std::vector<spv::Id> &)"
               );
}

Assistant:

spv::Id TGlslangToSpvTraverser::CreateInvocationsVectorOperation(spv::Op op, spv::GroupOperation groupOperation,
    spv::Id typeId, std::vector<spv::Id>& operands)
{
    assert(op == spv::OpGroupFMin || op == spv::OpGroupUMin || op == spv::OpGroupSMin ||
           op == spv::OpGroupFMax || op == spv::OpGroupUMax || op == spv::OpGroupSMax ||
           op == spv::OpGroupFAdd || op == spv::OpGroupIAdd || op == spv::OpGroupBroadcast ||
           op == spv::OpSubgroupReadInvocationKHR || op == spv::OpSubgroupFirstInvocationKHR ||
           op == spv::OpGroupFMinNonUniformAMD || op == spv::OpGroupUMinNonUniformAMD ||
           op == spv::OpGroupSMinNonUniformAMD ||
           op == spv::OpGroupFMaxNonUniformAMD || op == spv::OpGroupUMaxNonUniformAMD ||
           op == spv::OpGroupSMaxNonUniformAMD ||
           op == spv::OpGroupFAddNonUniformAMD || op == spv::OpGroupIAddNonUniformAMD);

    // Handle group invocation operations scalar by scalar.
    // The result type is the same type as the original type.
    // The algorithm is to:
    //   - break the vector into scalars
    //   - apply the operation to each scalar
    //   - make a vector out the scalar results

    // get the types sorted out
    int numComponents = builder.getNumComponents(operands[0]);
    spv::Id scalarType = builder.getScalarTypeId(builder.getTypeId(operands[0]));
    std::vector<spv::Id> results;

    // do each scalar op
    for (int comp = 0; comp < numComponents; ++comp) {
        std::vector<unsigned int> indexes;
        indexes.push_back(comp);
        spv::IdImmediate scalar = { true, builder.createCompositeExtract(operands[0], scalarType, indexes) };
        std::vector<spv::IdImmediate> spvGroupOperands;
        if (op == spv::OpSubgroupReadInvocationKHR) {
            spvGroupOperands.push_back(scalar);
            spv::IdImmediate operand = { true, operands[1] };
            spvGroupOperands.push_back(operand);
        } else if (op == spv::OpSubgroupFirstInvocationKHR) {
            spvGroupOperands.push_back(scalar);
        } else if (op == spv::OpGroupBroadcast) {
            spv::IdImmediate scope = { true, builder.makeUintConstant(spv::ScopeSubgroup) };
            spvGroupOperands.push_back(scope);
            spvGroupOperands.push_back(scalar);
            spv::IdImmediate operand = { true, operands[1] };
            spvGroupOperands.push_back(operand);
        } else {
            spv::IdImmediate scope = { true, builder.makeUintConstant(spv::ScopeSubgroup) };
            spvGroupOperands.push_back(scope);
            spv::IdImmediate groupOp = { false, (unsigned)groupOperation };
            spvGroupOperands.push_back(groupOp);
            spvGroupOperands.push_back(scalar);
        }

        results.push_back(builder.createOp(op, scalarType, spvGroupOperands));
    }

    // put the pieces together
    return builder.createCompositeConstruct(typeId, results);
}